

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O2

void __thiscall OpenMD::Thermo::getGyrationalVolume(Thermo *this,RealType *volume,RealType *detI)

{
  Snapshot *this_00;
  RealType RVar1;
  double dVar2;
  double dVar3;
  Vector3d dummyAngMom;
  Mat3x3d intTensor;
  Vector<double,_3U> local_90;
  SquareMatrix<double,_3> local_78;
  
  this_00 = this->info_->sman_->currentSnapshot_;
  if ((this_00->hasInertiaTensor == true) && (this_00->hasGyrationalVolume != false)) {
    RVar1 = Snapshot::getGyrationalVolume(this_00);
    *volume = RVar1;
    Snapshot::getInertiaTensor((Mat3x3d *)&local_78,this_00);
    dVar2 = SquareMatrix3<double>::determinant((SquareMatrix3<double> *)&local_78);
    *detI = dVar2;
  }
  else {
    SquareMatrix<double,_3>::SquareMatrix(&local_78);
    Vector<double,_3U>::Vector(&local_90);
    getInertiaTensor(this,(Mat3x3d *)&local_78,(Vector3d *)&local_90);
    dVar2 = SquareMatrix3<double>::determinant((SquareMatrix3<double> *)&local_78);
    *detI = dVar2;
    dVar3 = pow(1.5 / (double)this->info_->nGlobalIntegrableObjects_,1.5);
    dVar2 = *detI;
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    dVar2 = dVar3 * 4.1887902047863905 * dVar2;
    *volume = dVar2;
    Snapshot::setGyrationalVolume(this_00,dVar2);
  }
  return;
}

Assistant:

void Thermo::getGyrationalVolume(RealType& volume, RealType& detI) {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!(snap->hasInertiaTensor && snap->hasGyrationalVolume)) {
      Mat3x3d intTensor;
      Vector3d dummyAngMom;
      RealType sysconstants;
      RealType geomCnst;

      geomCnst = 3.0 / 2.0;
      /* Get the inertia tensor and angular momentum for free*/
      this->getInertiaTensor(intTensor, dummyAngMom);

      detI = intTensor.determinant();
      sysconstants =
          geomCnst / (RealType)(info_->getNGlobalIntegrableObjects());
      volume =
          4.0 / 3.0 * Constants::PI * pow(sysconstants, geomCnst) * sqrt(detI);
      snap->setGyrationalVolume(volume);
    } else {
      volume = snap->getGyrationalVolume();
      detI   = snap->getInertiaTensor().determinant();
    }
    return;
  }